

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *this)

{
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Tuple_impl<3UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<int>_>
                        .super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>_>.
                        super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>.
                        _M_head_impl + 0x18))();
  CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
  ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul>>::AdvanceIfEnd<4ul>
            ((IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul>> *)this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }